

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_PlusSign_Test::TestBody(FormatterTest_PlusSign_Test *this)

{
  bool bVar1;
  int *in_RCX;
  char *pcVar2;
  int *args;
  long *args_00;
  longlong *args_01;
  double *args_02;
  char *pcVar3;
  char (*args_03) [4];
  void **args_04;
  longdouble local_138;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_138 = (longdouble)CONCAT64(local_138._4_6_,0x2a);
  fmt::v5::format<char[6],int>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,in_RCX);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3b7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b7,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)CONCAT64(local_138._4_6_,0xffffffd6);
  fmt::v5::format<char[6],int>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,(int *)pcVar2);
  args = (int *)0x1ea562;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42\"","format(\"{0:+}\", -42)",(char (*) [4])0x1ea562,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (int *)0x3b8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b8,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)CONCAT64(local_138._4_6_,0x2a);
  fmt::v5::format<char[6],int>(&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,args);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3b9;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b9,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires signed argument",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT64(local_138._4_6_,0x2a);
      fmt::v5::format<char[6],unsigned_int>
                (&local_38,(v5 *)"{0:+}",(char (*) [6])&local_138,(uint *)pcVar2);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: format(\"{0:+}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_00 = (long *)0x3bb;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3bb,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)CONCAT28(local_138._8_2_,0x2a);
  fmt::v5::format<char[6],long>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,args_00);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42l)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3bc;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3bc,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires signed argument",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT28(local_138._8_2_,0x2a);
      fmt::v5::format<char[6],unsigned_long>
                (&local_58,(v5 *)"{0:+}",(char (*) [6])&local_138,(unsigned_long *)pcVar2);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:+}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_01 = (longlong *)0x3be;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3be,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)CONCAT28(local_138._8_2_,0x2a);
  fmt::v5::format<char[6],long_long>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,args_01);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42ll)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3bf;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3bf,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires signed argument",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT28(local_138._8_2_,0x2a);
      fmt::v5::format<char[6],unsigned_long_long>
                (&local_78,(v5 *)"{0:+}",(char (*) [6])&local_138,(unsigned_long_long *)pcVar2);
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:+}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_02 = (double *)0x3c1;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c1,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)CONCAT28(local_138._8_2_,0x4045000000000000);
  fmt::v5::format<char[6],double>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,args_02);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42.0)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3c2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3c2,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_138 = (longdouble)42.0;
  fmt::v5::format<char[6],long_double>
            (&gtest_expected_message,(v5 *)"{0:+}",(char (*) [6])&local_138,(longdouble *)pcVar2);
  pcVar2 = "+42";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+42\"","format(\"{0:+}\", 42.0l)",(char (*) [4])"+42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x3c3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3c3,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"missing \'}\' in format string",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT91(local_138._1_9_,99);
      fmt::v5::format<char[5],char>(&local_98,(v5 *)"{0:+",(char (*) [5])&local_138,pcVar2);
      std::__cxx11::string::~string((string *)&local_98);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [101])
               "Expected: format(\"{0:+\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pcVar3 = (char *)0x3c5;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c5,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format specifier for char",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT91(local_138._1_9_,99);
      fmt::v5::format<char[6],char>(&local_b8,(v5 *)"{0:+}",(char (*) [6])&local_138,pcVar3);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: format(\"{0:+}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_03 = (char (*) [4])0x3c7;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c7,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires numeric argument",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],char[4]>(&local_d8,(v5 *)"{0:+}",(char (*) [6])0x1e6e09,args_03);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:+}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_04 = (void **)0x3c9;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c9,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires numeric argument",
               (allocator *)&local_138);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (longdouble)CONCAT28(local_138._8_2_,0x42);
      fmt::v5::format<char[6],void*>(&local_f8,(v5 *)"{0:+}",(char (*) [6])&local_138,args_04);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [128])
               "Expected: format(\"{0:+}\", reinterpret_cast<void*>(0x42)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_138,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3cb,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_138,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, PlusSign) {
  EXPECT_EQ("+42", format("{0:+}", 42));
  EXPECT_EQ("-42", format("{0:+}", -42));
  EXPECT_EQ("+42", format("{0:+}", 42));
  EXPECT_THROW_MSG(format("{0:+}", 42u),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42l));
  EXPECT_THROW_MSG(format("{0:+}", 42ul),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42ll));
  EXPECT_THROW_MSG(format("{0:+}", 42ull),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42.0));
  EXPECT_EQ("+42", format("{0:+}", 42.0l));
  EXPECT_THROW_MSG(format("{0:+", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:+}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:+}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:+}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}